

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * multadd(Bigint *b,int m,int a)

{
  int iVar1;
  ulong uVar2;
  Bigint *b1;
  uint64 y;
  uint64 carry;
  uint32 *x;
  int wds;
  int i;
  int a_local;
  int m_local;
  Bigint *b_local;
  
  iVar1 = b->wds;
  x._4_4_ = 0;
  y = (uint64)a;
  carry = (uint64)b->x;
  do {
    uVar2 = (ulong)*(uint *)carry * (long)m + y;
    y = uVar2 >> 0x20;
    *(int *)carry = (int)uVar2;
    x._4_4_ = x._4_4_ + 1;
    carry = carry + 4;
  } while (x._4_4_ < iVar1);
  _a_local = b;
  if (y != 0) {
    if (b->maxwds <= iVar1) {
      _a_local = Balloc(b->k + 1);
      if (_a_local == (Bigint *)0x0) {
        Bfree(b);
        return (Bigint *)0x0;
      }
      memcpy(&_a_local->sign,&b->sign,(long)b->wds * 4 + 8);
      Bfree(b);
    }
    _a_local->x[iVar1] = (uint32)(uVar2 >> 0x20);
    _a_local->wds = iVar1 + 1;
  }
  return _a_local;
}

Assistant:

static Bigint *
multadd(Bigint *b, int m, int a)       /* multiply by m and add a */
{
    int i, wds;
#ifdef ULLong
    ULong *x;
    ULLong carry, y;
#else
    ULong carry, *x, y;
    ULong xi, z;
#endif
    Bigint *b1;

    wds = b->wds;
    x = b->x;
    i = 0;
    carry = a;
    do {
#ifdef ULLong
        y = *x * (ULLong)m + carry;
        carry = y >> 32;
        *x++ = (ULong)(y & FFFFFFFF);
#else
        xi = *x;
        y = (xi & 0xffff) * m + carry;
        z = (xi >> 16) * m + (y >> 16);
        carry = z >> 16;
        *x++ = (z << 16) + (y & 0xffff);
#endif
    }
    while(++i < wds);
    if (carry) {
        if (wds >= b->maxwds) {
            b1 = Balloc(b->k+1);
            if (b1 == NULL){
                Bfree(b);
                return NULL;
            }
            Bcopy(b1, b);
            Bfree(b);
            b = b1;
        }
        b->x[wds++] = (ULong)carry;
        b->wds = wds;
    }
    return b;
}